

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

int __thiscall
trieste::detail::Inside<3UL>::clone
          (Inside<3UL> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  Inside<3UL> *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  this_local = this;
  std::make_shared<trieste::detail::Inside<3ul>,trieste::detail::Inside<3ul>const&>
            ((Inside<3UL> *)&stack0xffffffffffffffd8);
  std::shared_ptr<trieste::detail::PatternDef>::shared_ptr<trieste::detail::Inside<3ul>,void>
            ((shared_ptr<trieste::detail::PatternDef> *)this,
             (shared_ptr<trieste::detail::Inside<3UL>_> *)&stack0xffffffffffffffd8);
  std::shared_ptr<trieste::detail::Inside<3UL>_>::~shared_ptr
            ((shared_ptr<trieste::detail::Inside<3UL>_> *)&stack0xffffffffffffffd8);
  return (int)this;
}

Assistant:

PatternPtr clone() const& override
      {
        return std::make_shared<Inside>(*this);
      }